

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void changes(sqlite3_context *context,int NotUsed,sqlite3_value **NotUsed2)

{
  Mem *p;
  MemValue MVar1;
  
  p = context->pOut;
  MVar1 = (MemValue)p->db->nChange;
  if ((p->flags & 0x9000) == 0) {
    p->u = MVar1;
    p->flags = 4;
    return;
  }
  if ((p->flags & 0x9000) != 0) {
    vdbeMemClearExternAndSetNull(p);
  }
  p->u = MVar1;
  p->flags = 4;
  return;
}

Assistant:

SQLITE_API sqlite3 *sqlite3_context_db_handle(sqlite3_context *p){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( p==0 ) return 0;
#else
  assert( p && p->pOut );
#endif
  return p->pOut->db;
}